

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::AttachmentDescription::AttachmentDescription
          (AttachmentDescription *this,VkFormat _format,VkSampleCountFlagBits _samples,
          VkAttachmentLoadOp _loadOp,VkAttachmentStoreOp _storeOp,VkAttachmentLoadOp _stencilLoadOp,
          VkAttachmentStoreOp _stencilStoreOp,VkImageLayout _initialLayout,
          VkImageLayout _finalLayout)

{
  (this->super_VkAttachmentDescription).flags = 0;
  (this->super_VkAttachmentDescription).format = _format;
  (this->super_VkAttachmentDescription).samples = _samples;
  (this->super_VkAttachmentDescription).loadOp = _loadOp;
  (this->super_VkAttachmentDescription).storeOp = _storeOp;
  (this->super_VkAttachmentDescription).stencilLoadOp = _stencilLoadOp;
  (this->super_VkAttachmentDescription).stencilStoreOp = _stencilStoreOp;
  (this->super_VkAttachmentDescription).initialLayout = _initialLayout;
  (this->super_VkAttachmentDescription).finalLayout = _finalLayout;
  return;
}

Assistant:

AttachmentDescription::AttachmentDescription (vk::VkFormat				_format,
											  vk::VkSampleCountFlagBits	_samples,
											  vk::VkAttachmentLoadOp	_loadOp,
											  vk::VkAttachmentStoreOp	_storeOp,
											  vk::VkAttachmentLoadOp	_stencilLoadOp,
											  vk::VkAttachmentStoreOp	_stencilStoreOp,
											  vk::VkImageLayout			_initialLayout,
											  vk::VkImageLayout			_finalLayout)
{
	flags = 0;
	format			= _format;
	samples			= _samples;
	loadOp			= _loadOp;
	storeOp			= _storeOp;
	stencilLoadOp	= _stencilLoadOp;
	stencilStoreOp	= _stencilStoreOp;
	initialLayout	= _initialLayout;
	finalLayout		= _finalLayout;
}